

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# align_widget.cxx
# Opt level: O0

void widget_size_cb(Fl_Widget *param_1,long size)

{
  int iVar1;
  Fl_Window *pFVar2;
  undefined1 local_3c [4];
  undefined4 local_38;
  Fl_Color c;
  int s;
  Fl_Font f;
  Fl_Widget *w;
  Fl_Type *o;
  long lStack_18;
  int changed;
  long size_local;
  Fl_Widget *param_0_local;
  
  o._4_4_ = 0;
  lStack_18 = size;
  size_local = (long)param_1;
  for (w = (Fl_Widget *)Fl_Type::first; w != (Fl_Widget *)0x0; w = *(Fl_Widget **)&(w->label_).color
      ) {
    if ((*(char *)((long)&(w->label_).deimage + 1) != '\0') &&
       (iVar1 = (*w->_vptr_Fl_Widget[0x17])(), iVar1 != 0)) {
      if (o._4_4_ == 0) {
        o._4_4_ = 1;
        set_modflag(1);
        undo_checkpoint();
      }
      _s = *(Fl_Widget **)&w[1].label_.type;
      Fl_Widget::labelsize(_s,(Fl_Fontsize)lStack_18);
      local_38 = (undefined4)lStack_18;
      (*w->_vptr_Fl_Widget[0x2b])(w,2,&c,&local_38,local_3c);
      Fl_Widget::redraw(_s);
      pFVar2 = Fl_Widget::window(_s);
      if (pFVar2 != (Fl_Window *)0x0) {
        pFVar2 = Fl_Widget::window(_s);
        Fl_Widget::redraw((Fl_Widget *)pFVar2);
      }
    }
  }
  return;
}

Assistant:

void widget_size_cb(Fl_Widget *, long size) {
  // Update any selected widgets...
  int changed = 0;
  for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
    if (o->selected && o->is_widget()) {
      if (!changed) {
	changed = 1;
	set_modflag(1);
	undo_checkpoint();
      }

      Fl_Widget *w = ((Fl_Widget_Type *)o)->o;
      w->labelsize((Fl_Font)size);
      Fl_Font f;
      int s = (int)size;
      Fl_Color c;
      ((Fl_Widget_Type *)o)->textstuff(2, f, s, c);

      w->redraw();
      // since this may be a major change, the whole window should be redrawn
      if (w->window()) w->window()->redraw();
    }
  }
}